

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O3

void __thiscall
glcts::DrawBuffersIndexedColorMasks::prepareFramebuffer(DrawBuffersIndexedColorMasks *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  ResourceError *this_00;
  GLint maxDrawBuffers;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufs;
  int local_48;
  allocator_type local_41;
  string local_40;
  long lVar2;
  
  iVar1 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_48 = 0;
  (**(code **)(lVar2 + 0x868))(0x8824,&local_48);
  if (3 < local_48) {
    (**(code **)(lVar2 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar2 + 0x78))(0x8d40,this->m_fbo);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,(long)local_48,
               &local_41);
    if (0 < local_48) {
      lVar3 = 0;
      do {
        *(int *)(local_40._M_dataplus._M_p + lVar3 * 4) = (int)lVar3 + 0x8ce0;
        lVar3 = lVar3 + 1;
      } while (lVar3 < local_48);
    }
    (**(code **)(lVar2 + 0x560))();
    (**(code **)(lVar2 + 0x4e8))(0xbd0);
    if (local_40._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_40._M_dataplus._M_p,
                      local_40.field_2._M_allocated_capacity - (long)local_40._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Minimum number of draw buffers too low","");
  tcu::ResourceError::ResourceError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::ResourceError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawBuffersIndexedColorMasks::prepareFramebuffer()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		throw tcu::ResourceError("Minimum number of draw buffers too low");
	}

	gl.genFramebuffers(1, &m_fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);

	std::vector<glw::GLenum> bufs(maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		bufs[i] = GL_COLOR_ATTACHMENT0 + i;
	}
	gl.drawBuffers(maxDrawBuffers, &bufs[0]);

	gl.disable(GL_DITHER);
}